

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

vector<CSegment_*,_std::allocator<CSegment_*>_> * __thiscall
CWire::Bend(vector<CSegment_*,_std::allocator<CSegment_*>_> *__return_storage_ptr__,CWire *this,
           int iX1,int iY1,int iX2,int iY2,int iZ1,int iZ2,int iZ3)

{
  pointer *pppCVar1;
  CSegment *this_00;
  CSegment *this_01;
  CSegment *this_02;
  iterator iVar2;
  CSegment *pNNSegment;
  CSegment *pNSegment;
  CSegment *pSegment;
  CSegment *local_48;
  CSegment *local_40;
  CSegment *local_38;
  
  (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = CSegment::New();
  local_38 = this_00;
  this_01 = CSegment::New();
  local_40 = this_01;
  this_02 = CSegment::New();
  local_48 = this_02;
  if (this_00 == (CSegment *)0x0) {
    __assert_fail("pSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x42b,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
  }
  if (this_01 != (CSegment *)0x0) {
    if (this_02 != (CSegment *)0x0) {
      CSegment::Initialize
                (this_00,(int)this->m_pPointS->m_iX,(int)this->m_pPointS->m_iY,iX1,iY1,iZ1,this);
      CSegment::Initialize(this_01,iX1,iY1,iX2,iY2,iZ2,this);
      CSegment::Initialize
                (this_02,iX2,iY2,(int)this->m_pPointE->m_iX,(int)this->m_pPointE->m_iY,iZ3,this);
      std::vector<CSegment*,std::allocator<CSegment*>>::_M_realloc_insert<CSegment*const&>
                ((vector<CSegment*,std::allocator<CSegment*>> *)__return_storage_ptr__,(iterator)0x0
                 ,&local_38);
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CSegment*,std::allocator<CSegment*>>::_M_realloc_insert<CSegment*const&>
                  ((vector<CSegment*,std::allocator<CSegment*>> *)__return_storage_ptr__,iVar2,
                   &local_40);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = this_01;
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
             _M_impl.super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CSegment*,std::allocator<CSegment*>>::_M_realloc_insert<CSegment*const&>
                  ((vector<CSegment*,std::allocator<CSegment*>> *)__return_storage_ptr__,iVar2,
                   &local_48);
      }
      else {
        *iVar2._M_current = this_02;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      return __return_storage_ptr__;
    }
    __assert_fail("pNNSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x42d,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
  }
  __assert_fail("pNSegment",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x42c,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
}

Assistant:

vector<CSegment*> CWire::Bend(int iX1, int iY1, int iX2, int iY2, int iZ1, int iZ2, int iZ3)
{
	vector<CSegment*>	Candidate;

	CSegment*	pSegment	=	CSegment::New();//new	CSegment;
	CSegment*	pNSegment	=	CSegment::New();//new	CSegment;
	CSegment*	pNNSegment	=	CSegment::New();//new	CSegment;
	
	assert(pSegment);
	assert(pNSegment);
	assert(pNNSegment);
	
	pSegment->Initialize(m_pPointS->X(),m_pPointS->Y(),iX1,iY1,iZ1,this);
	pNSegment->Initialize(iX1,iY1,iX2,iY2,iZ2,this);
	pNNSegment->Initialize(iX2,iY2,m_pPointE->X(),m_pPointE->Y(),iZ3,this);
	
	Candidate.push_back(pSegment);
	Candidate.push_back(pNSegment);
	Candidate.push_back(pNNSegment);
	
	return	Candidate;
}